

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::getForce(PeleLM *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,FArrayBox *Vel,
                FArrayBox *Scal,int scalScomp,MFIter *mfi)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int in_ECX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  element_type *in_XMM0_Qa;
  long in_stack_00000008;
  int in_stack_00000010;
  FArrayBox *ext_force;
  Real dV_control;
  int pseudo_gravity;
  Real grav;
  GpuArray<double,_3U> dx;
  Array4<double> *f;
  Array4<const_double> *scalars;
  Array4<const_double> *velocity;
  MFIter *in_stack_fffffffffffffa18;
  FabArray<amrex::FArrayBox> *this_00;
  undefined1 local_5b0 [24];
  anon_class_256_10_a7f7ef82 *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa74;
  int in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  Box *in_stack_fffffffffffffa80;
  BaseFab<double> *in_stack_fffffffffffffa88;
  BaseFab<double> *in_stack_fffffffffffffa90;
  undefined1 auStack_530 [64];
  element_type *local_4f0;
  Real local_4e8;
  int local_4e0;
  Real local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  int local_4b8;
  int local_4b4;
  Real local_4b0;
  int local_4a4;
  Real local_4a0;
  GpuArray<double,_3U> local_498;
  Array4<double> local_480;
  Array4<double> *local_440;
  Array4<const_double> local_438;
  Array4<const_double> *local_3f8;
  undefined1 local_3f0 [188];
  int local_334;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  Array4<const_double> local_320;
  int local_2dc;
  Array4<const_double> *local_2d0;
  int local_2c8;
  MultiArray4<const_double> local_2c0;
  int local_2b8;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_2b0;
  int local_2a8;
  _Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_2a0;
  int local_298;
  int local_294;
  undefined8 *local_290;
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_288;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_280;
  int local_278;
  undefined8 *local_270;
  undefined4 local_268;
  undefined4 uStack_264;
  int local_260;
  undefined4 local_25c;
  undefined8 *local_258;
  undefined4 local_24c;
  undefined8 *local_248;
  undefined4 local_23c;
  undefined8 *local_238;
  Array4<const_double> *local_230;
  int local_228;
  undefined8 *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  _Atomic_word *local_b0;
  _func_int **local_a8;
  Dim3 local_a0;
  _Atomic_word *local_90;
  _Atomic_word local_88;
  _Atomic_word _Stack_84;
  int local_80;
  undefined4 local_7c;
  _Atomic_word *local_78;
  undefined4 local_6c;
  _Atomic_word *local_68;
  undefined4 local_5c;
  _Atomic_word *local_58;
  Dim3 local_50;
  _Atomic_word *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_198 = *(double **)(in_R9 + 0x10);
  local_1a0 = (undefined8 *)(in_R9 + 0x18);
  local_1a4 = *(int *)(in_R9 + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(in_R9 + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(in_R9 + 0x20);
  local_f8 = (int *)(in_R9 + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = in_R9 + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(in_R9 + 0x28) + 1;
  local_118 = in_R9 + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(in_R9 + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  this_00 = (FabArray<amrex::FArrayBox> *)local_3f0;
  local_3f0._80_8_ = in_XMM0_Qa;
  local_3f0._88_4_ = in_R8D;
  local_3f0._92_4_ = in_ECX;
  local_3f0._104_8_ = in_RSI;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  amrex::Array4<const_double>::Array4
            ((Array4<const_double> *)this_00,local_198,&local_1b0,&local_1d0,local_1a4);
  local_2dc = in_stack_00000010;
  local_288._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
       ((__uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
         *)(in_stack_00000008 + 0x10))->_M_t;
  local_290 = (undefined8 *)(in_stack_00000008 + 0x18);
  local_294 = *(int *)(in_stack_00000008 + 0x34);
  local_23c = 0;
  local_268 = *(undefined4 *)local_290;
  local_24c = 1;
  uStack_264 = *(undefined4 *)(in_stack_00000008 + 0x1c);
  local_2b0._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
       (tuple<amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
        )*local_290;
  local_25c = 2;
  local_2a8 = *(int *)(in_stack_00000008 + 0x20);
  local_1e8 = (int *)(in_stack_00000008 + 0x24);
  local_1ec = 0;
  local_218 = *local_1e8 + 1;
  local_1f8 = in_stack_00000008 + 0x24;
  local_1fc = 1;
  iStack_214 = *(int *)(in_stack_00000008 + 0x28) + 1;
  local_208 = in_stack_00000008 + 0x24;
  local_20c = 2;
  local_2c8 = *(int *)(in_stack_00000008 + 0x2c) + 1;
  local_2d0 = (Array4<const_double> *)CONCAT44(iStack_214,local_218);
  local_3f0._64_8_ = this_00;
  local_2c0.hp = local_2d0;
  local_2b8 = local_2c8;
  local_2a0.super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
       (_Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>)
       (_Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>)
       local_2b0._M_t.
       super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_298 = local_2a8;
  local_280._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
        )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
          )local_2b0._M_t.
           super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_278 = local_2a8;
  local_270 = local_290;
  local_260 = local_2a8;
  local_258 = local_290;
  local_248 = local_290;
  local_238 = local_290;
  local_230 = local_2d0;
  local_228 = local_2c8;
  local_220 = local_290;
  local_210 = local_2c8;
  amrex::Array4<const_double>::Array4
            (&local_320,
             (double *)
             local_288._M_t.
             super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl,
             (Dim3 *)&local_2a0,(Dim3 *)&local_2c0,local_294);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_438,&local_320,local_2dc);
  local_330 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._104_8_;
  local_334 = local_3f0._92_4_;
  local_a8 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x10))->
             _vptr__Sp_counted_base;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x10);
  local_b0 = &p_Var1->_M_use_count;
  local_b4 = *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_3f0._104_8_ + 0x30))->_vptr__Sp_counted_base + 4);
  local_5c = 0;
  local_88 = *local_b0;
  local_6c = 1;
  _Stack_84 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x10))->
              _M_weak_count;
  local_d0.x = p_Var1->_M_use_count;
  local_d0.y = p_Var1->_M_weak_count;
  local_7c = 2;
  local_d0.z = *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x20))
                        ->_vptr__Sp_counted_base;
  local_8 = (int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           (local_3f0._104_8_ + 0x20))->_vptr__Sp_counted_base + 4);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = (undefined1 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x20))->
                     _vptr__Sp_counted_base + 4);
  local_1c = 1;
  iStack_34 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x20))->
              _M_use_count + 1;
  local_28 = (undefined1 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x20))->
                     _vptr__Sp_counted_base + 4);
  local_2c = 2;
  local_f0.z = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3f0._104_8_ + 0x20))->
               _M_weak_count + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_3f8 = &local_438;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  amrex::Array4<double>::Array4
            ((Array4<double> *)(local_3f0 + 0x78),(double *)local_a8,&local_c0,&local_dc,local_b4);
  amrex::Array4<double>::Array4<double,_0>
            (&local_480,(Array4<double> *)(local_3f0 + 0x78),local_334);
  local_440 = &local_480;
  amrex::CoordSys::CellSizeArray(&local_498,(CoordSys *)(in_RDI + 0x10));
  local_4a0 = NavierStokesBase::gravity;
  local_4a4 = ctrl_pseudoGravity;
  local_4b0 = ctrl_dV;
  memcpy(local_5b0,local_440,0x3c);
  memcpy(&stack0xfffffffffffffa90,local_3f8,0x3c);
  memcpy(auStack_530,(void *)local_3f0._64_8_,0x3c);
  local_4f0 = (element_type *)local_3f0._80_8_;
  local_4e8 = local_4a0;
  local_4e0 = local_4a4;
  local_4d8 = local_4b0;
  local_4d0 = local_498.arr[0];
  local_4c8 = local_498.arr[1];
  local_4c0 = local_498.arr[2];
  local_4b8 = local_3f0._92_4_;
  local_4b4 = local_3f0._88_4_;
  amrex::
  ParallelFor<PeleLM::getForce(amrex::FArrayBox&,amrex::Box_const&,int,int,double,amrex::FArrayBox_const&,amrex::FArrayBox_const&,int,amrex::MFIter_const&)::__0>
            ((Box *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa68);
  if ((local_3f0._92_4_ == 0) && (local_3f0._88_4_ == 3)) {
    amrex::FabArray<amrex::FArrayBox>::operator[](this_00,in_stack_fffffffffffffa18);
    amrex::BaseFab<double>::plus<(amrex::RunOn)0>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
  }
  return;
}

Assistant:

void
PeleLM::getForce(FArrayBox&       force,
                 const Box&       bx,
                 int              scomp,
                 int              ncomp,
                 const Real       time,
                 const FArrayBox& Vel,
                 const FArrayBox& Scal,
                 int              scalScomp,
                 const MFIter&    mfi)
{
   AMREX_ASSERT(force.box().contains(bx));

   const auto& velocity = Vel.array();
   const auto& scalars  = Scal.array(scalScomp);
   const auto& f        = force.array(scomp);

   const auto  dx       = geom.CellSizeArray();
   const Real  grav     = gravity;

   // Get non-static info for the pseudo gravity forcing
   int pseudo_gravity    = ctrl_pseudoGravity;
   const Real dV_control = ctrl_dV;

   amrex::ParallelFor(bx, [f, scalars, velocity, time, grav, pseudo_gravity, dV_control, dx, scomp, ncomp]
   AMREX_GPU_DEVICE(int i, int j, int k) noexcept
   {
      makeForce(i,j,k, scomp, ncomp, pseudo_gravity, time, grav, dV_control, dx, velocity, scalars, f);
   });
   // Velocity forcing
   if (scomp == Xvel && ncomp == AMREX_SPACEDIM) {
     const FArrayBox& ext_force = external_sources[mfi];
     force.plus<RunOn::Device>(ext_force, bx, Xvel, Xvel, AMREX_SPACEDIM);
   }
}